

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingScanPartial<duckdb::uhugeint_t,duckdb::hugeint_t,duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  BitpackingMode BVar1;
  byte width;
  data_ptr_t pdVar2;
  uint64_t uVar3;
  uhugeint_t *puVar4;
  bool bVar5;
  BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this;
  long lVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint64_t *puVar11;
  uhugeint_t *out;
  ulong uVar12;
  uhugeint_t *puVar13;
  uhugeint_t uVar14;
  hugeint_t hVar15;
  hugeint_t frame_of_reference;
  hugeint_t previous_value;
  uhugeint_t local_a8;
  uhugeint_t local_98;
  data_ptr_t local_88;
  uhugeint_t *local_80;
  uhugeint_t *local_78;
  uhugeint_t *local_70;
  uhugeint_t *local_68;
  data_ptr_t local_60;
  uhugeint_t local_58;
  uhugeint_t local_40;
  size_t size;
  
  this = (BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar2 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (scan_count != 0) {
    local_88 = pdVar2 + result_offset * 0x10;
    puVar13 = &this->current_constant;
    local_78 = &this->current_frame_of_reference;
    local_68 = this->decompression_buffer;
    local_70 = &this->current_delta_offset;
    iVar7 = this->current_group_offset;
    local_60 = pdVar2 + result_offset * 0x10 + 8;
    uVar12 = 0;
    local_80 = puVar13;
    do {
      if (iVar7 == 0x800) {
        BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t>::LoadNextGroup(this);
        iVar7 = this->current_group_offset;
      }
      puVar4 = local_68;
      BVar1 = (this->current_group).mode;
      if (BVar1 == CONSTANT_DELTA) {
        uVar8 = 0x800 - iVar7;
        if (scan_count - uVar12 < 0x800 - iVar7) {
          uVar8 = scan_count - uVar12;
        }
        if (uVar8 != 0) {
          puVar11 = (uint64_t *)(local_60 + uVar12 * 0x10);
          uVar9 = 0;
          do {
            local_98.lower = local_80->lower;
            local_98.upper = local_80->upper;
            uhugeint_t::uhugeint_t(&local_40,this->current_group_offset + uVar9);
            local_a8 = uhugeint_t::operator*(&local_98,&local_40);
            local_58.lower = local_78->lower;
            local_58.upper = local_78->upper;
            uVar14 = uhugeint_t::operator+(&local_a8,&local_58);
            puVar11[-1] = uVar14.lower;
            *puVar11 = uVar14.upper;
            uVar9 = uVar9 + 1;
            puVar11 = puVar11 + 2;
          } while (uVar8 != uVar9);
          iVar7 = this->current_group_offset;
          puVar13 = local_80;
        }
LAB_005a411a:
        iVar7 = iVar7 + uVar8;
      }
      else {
        if (BVar1 == CONSTANT) {
          lVar6 = uVar12 << 4;
          do {
            uVar3 = puVar13->upper;
            *(uint64_t *)(local_88 + lVar6) = puVar13->lower;
            *(uint64_t *)((long)(local_88 + lVar6) + 8) = uVar3;
            lVar6 = lVar6 + 0x10;
          } while (scan_count << 4 != lVar6);
          uVar8 = scan_count - uVar12;
          if (0x800 - iVar7 <= scan_count - uVar12) {
            uVar8 = 0x800 - iVar7;
          }
          iVar7 = this->current_group_offset;
          goto LAB_005a411a;
        }
        uVar10 = (uint)iVar7 & 0x1f;
        size = (size_t)uVar10;
        uVar8 = 0x20 - size;
        if (scan_count - uVar12 < 0x20 - size) {
          uVar8 = scan_count - uVar12;
        }
        width = this->current_width;
        out = (uhugeint_t *)(local_88 + uVar12 * 0x10);
        if (uVar8 == 0x20) {
          HugeIntPacker::Unpack
                    ((uint32_t *)
                     (this->current_group_ptr +
                     ((width * iVar7 >> 3) - (ulong)(width * uVar10 >> 3))),out,width);
        }
        else {
          HugeIntPacker::Unpack
                    ((uint32_t *)
                     (this->current_group_ptr +
                     ((width * iVar7 >> 3) - (ulong)(width * uVar10 >> 3))),local_68,width);
          switchD_00b03519::default
                    (out,(void *)((long)&puVar4->lower + (ulong)(uVar10 << 4)),uVar8 << 4);
        }
        if ((this->current_group).mode == DELTA_FOR) {
          hVar15 = uhugeint_t::operator_cast_to_hugeint_t(local_78);
          frame_of_reference.lower = hVar15.upper;
          frame_of_reference.upper = uVar8;
          ApplyFrameOfReference<duckdb::hugeint_t>
                    ((duckdb *)out,(hugeint_t *)hVar15.lower,frame_of_reference,size);
          puVar4 = local_70;
          hVar15 = uhugeint_t::operator_cast_to_hugeint_t(local_70);
          previous_value.lower = hVar15.upper;
          previous_value.upper = uVar8;
          DeltaDecode<duckdb::hugeint_t>
                    ((duckdb *)out,(hugeint_t *)hVar15.lower,previous_value,size);
          uVar3 = out[uVar8 - 1].upper;
          puVar4->lower = out[uVar8 - 1].lower;
          puVar4->upper = uVar3;
        }
        else {
          local_a8 = *local_78;
          bVar5 = uhugeint_t::operator!(&local_a8);
          uVar9 = uVar8;
          if (!bVar5) {
            do {
              local_98.lower = local_a8.lower;
              local_98.upper = local_a8.upper;
              uhugeint_t::operator+=(out,&local_98);
              out = out + 1;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
        }
        iVar7 = this->current_group_offset + uVar8;
      }
      this->current_group_offset = iVar7;
      uVar12 = uVar12 + uVar8;
    } while (uVar12 < scan_count);
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}